

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDFloat32x4Operation::OpClamp(SIMDValue *value,SIMDValue *lower,SIMDValue *upper)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar1 = insertps((undefined1  [16])value->field_0,(value->field_0).i32[2],0x10);
  auVar3 = insertps((undefined1  [16])lower->field_0,(lower->field_0).i32[2],0x10);
  auVar6 = insertps(ZEXT416((value->field_0).u32[1]),(value->field_0).i32[3],0x10);
  auVar4._0_8_ = auVar1._0_8_;
  auVar4._8_4_ = auVar1._4_4_;
  auVar4._12_4_ = auVar6._4_4_;
  auVar2._8_8_ = auVar4._8_8_;
  auVar2._0_4_ = auVar1._0_4_;
  auVar2._4_4_ = auVar6._0_4_;
  auVar7 = insertps(ZEXT416((lower->field_0).u32[1]),(lower->field_0).i32[3],0x10);
  auVar4 = insertps((undefined1  [16])upper->field_0,(upper->field_0).i32[2],0x10);
  auVar6._0_8_ = auVar3._0_8_;
  auVar6._8_4_ = auVar3._4_4_;
  auVar6._12_4_ = auVar7._4_4_;
  auVar1._8_8_ = auVar6._8_8_;
  auVar1._0_4_ = auVar3._0_4_;
  auVar1._4_4_ = auVar7._0_4_;
  auVar6 = insertps(ZEXT416((upper->field_0).u32[1]),(upper->field_0).i32[3],0x10);
  auVar1 = maxps(auVar1,auVar2);
  auVar7._0_8_ = auVar4._0_8_;
  auVar7._8_4_ = auVar4._4_4_;
  auVar7._12_4_ = auVar6._4_4_;
  auVar3._8_8_ = auVar7._8_8_;
  auVar3._0_4_ = auVar4._0_4_;
  auVar3._4_4_ = auVar6._0_4_;
  aVar5 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)minps(auVar3,auVar1);
  return (SIMDValue)aVar5;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpClamp(const SIMDValue& value, const SIMDValue& lower, const SIMDValue& upper)
    { // SIMD review: do we have intrinsic for the implementation?
        SIMDValue result;

        // lower clamp
        result.f32[SIMD_X] = value.f32[SIMD_X] < lower.f32[SIMD_X] ? lower.f32[SIMD_X] : value.f32[SIMD_X];
        result.f32[SIMD_Y] = value.f32[SIMD_Y] < lower.f32[SIMD_Y] ? lower.f32[SIMD_Y] : value.f32[SIMD_Y];
        result.f32[SIMD_Z] = value.f32[SIMD_Z] < lower.f32[SIMD_Z] ? lower.f32[SIMD_Z] : value.f32[SIMD_Z];
        result.f32[SIMD_W] = value.f32[SIMD_W] < lower.f32[SIMD_W] ? lower.f32[SIMD_W] : value.f32[SIMD_W];

        // upper clamp
        result.f32[SIMD_X] = result.f32[SIMD_X] > upper.f32[SIMD_X] ? upper.f32[SIMD_X] : result.f32[SIMD_X];
        result.f32[SIMD_Y] = result.f32[SIMD_Y] > upper.f32[SIMD_Y] ? upper.f32[SIMD_Y] : result.f32[SIMD_Y];
        result.f32[SIMD_Z] = result.f32[SIMD_Z] > upper.f32[SIMD_Z] ? upper.f32[SIMD_Z] : result.f32[SIMD_Z];
        result.f32[SIMD_W] = result.f32[SIMD_W] > upper.f32[SIMD_W] ? upper.f32[SIMD_W] : result.f32[SIMD_W];

        return result;
    }